

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O0

DateTime DateTime::Now(bool useMicroseconds)

{
  rep rVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000000L>_> local_20;
  undefined1 local_11;
  DateTime DStack_10;
  bool useMicroseconds_local;
  
  local_11 = useMicroseconds;
  if (useMicroseconds) {
    local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_28.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ::time_since_epoch(&local_30);
    local_20.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_28);
    rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_20);
    DateTime(&stack0xfffffffffffffff0,rVar1 + 0xdcbffeff2bc000);
  }
  else {
    local_48.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_40.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ::time_since_epoch(&local_48);
    local_38.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_40);
    rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_38);
    DateTime(&stack0xfffffffffffffff0,rVar1 * 1000000 + 0xdcbffeff2bc000);
  }
  return (DateTime)DStack_10.m_encoded;
}

Assistant:

static DateTime Now(bool useMicroseconds = false)
    {
        using namespace std::chrono;
        if (useMicroseconds)
        {
            return DateTime(UnixEpoch +
                    duration_cast<microseconds>(system_clock::now()
                    .time_since_epoch()).count() * TicksPerMicrosecond);
        }
        else
        {
            return DateTime(UnixEpoch +
                duration_cast<seconds>(system_clock::now()
                    .time_since_epoch()).count() * TicksPerSecond);
        }
    }